

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_0::AsyncifyAssertInNonInstrumented::runOnFunction
          (AsyncifyAssertInNonInstrumented *this,Module *module_,Function *func)

{
  char *pcVar1;
  AsyncifyBuilder *pAVar2;
  size_t sVar3;
  Index index;
  mapped_type *pmVar4;
  AsyncifyBuilder *pAVar5;
  Expression *pEVar6;
  LocalSet *first;
  Block *this_00;
  TaskFunc_conflict1 p_Var7;
  Type in_R8;
  Walker_conflict local_138;
  Expression **local_48;
  uintptr_t uStack_40;
  
  local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.replacep = (Expression **)func;
  pmVar4 = std::
           map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
           ::operator[](&this->analyzer->map,(key_type *)&local_138);
  if ((pmVar4->canChangeState != true) || ((pmVar4->isTopMostRuntime & 1U) != 0)) {
    this->module = module_;
    pcVar1 = (this->asyncifyMemory).super_IString.str._M_str;
    pAVar5 = (AsyncifyBuilder *)operator_new(0x28);
    (pAVar5->super_Builder).wasm = module_;
    pAVar5->wasm = module_;
    sVar3 = (this->asyncifyMemory).super_IString.str._M_len;
    (pAVar5->pointerType).id = (this->pointerType).id;
    (pAVar5->asyncifyMemory).super_IString.str._M_len = sVar3;
    (pAVar5->asyncifyMemory).super_IString.str._M_str = pcVar1;
    pAVar2 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
             .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
             _M_head_impl;
    (this->builder)._M_t.
    super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
    .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>._M_head_impl =
         pAVar5;
    if (pAVar2 != (AsyncifyBuilder *)0x0) {
      operator_delete(pAVar2,0x28);
    }
    index = Builder::addVar((Builder *)func,(Function *)0x0,(Name)(ZEXT816(2) << 0x40),in_R8);
    pAVar2 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
             .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
             _M_head_impl;
    local_48 = (Expression **)wasm::(anonymous_namespace)::ASYNCIFY_STATE;
    uStack_40 = DAT_00da77d0;
    pEVar6 = (Expression *)MixedArena::allocSpace(&((pAVar2->super_Builder).wasm)->allocator,0x20,8)
    ;
    pEVar6->_id = GlobalGetId;
    *(Expression ***)(pEVar6 + 1) = local_48;
    pEVar6[1].type.id = uStack_40;
    (pEVar6->type).id = 2;
    first = Builder::makeLocalSet(&pAVar2->super_Builder,index,pEVar6);
    local_48 = &func->body;
    pEVar6 = func->body;
    this_00 = Builder::makeBlock(&pAVar2->super_Builder,(Expression *)first);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_00->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar6);
    Block::finalize(this_00);
    func->body = (Expression *)this_00;
    local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
    super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.replacep = (Expression **)0x0;
    local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
    super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.usedFixed = 0;
    local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
    super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
    super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
    super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
    super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.currFunction = (Function *)0x0;
    local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
    super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.currModule = (Module *)0x0;
    local_138.builder =
         (this->builder)._M_t.
         super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
         .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>._M_head_impl;
    local_138.func = func;
    local_138.oldState = index;
    Walker<Walker,_wasm::Visitor<Walker,_void>_>::pushTask
              ((Walker<Walker,_wasm::Visitor<Walker,_void>_> *)&local_138,
               PostWalker<Walker,_wasm::Visitor<Walker,_void>_>::scan,local_48);
    if (((long)local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
               super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
               super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start >> 4) +
        local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
        super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.usedFixed != 0) {
      do {
        if (local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
            super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
            super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
            super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
            super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
              super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.usedFixed == 0) {
            __assert_fail("usedFixed > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/small_vector.h"
                          ,0x5a,
                          "T &wasm::SmallVector<wasm::Walker<Walker, wasm::Visitor<Walker>>::Task, 10>::back() [T = wasm::Walker<Walker, wasm::Visitor<Walker>>::Task, N = 10]"
                         );
          }
          p_Var7 = local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                   super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.fixed._M_elems
                   [local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                    super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.usedFixed - 1].func;
          local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
          super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.replacep =
               local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
               super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.fixed._M_elems
               [local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.usedFixed - 1].currp;
          local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
          super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.usedFixed =
               local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
               super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.usedFixed - 1;
        }
        else {
          p_Var7 = local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                   super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
                   super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].func;
          local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
          super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.replacep =
               local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
               super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].currp;
          local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
          super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
               super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
        }
        if (*local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
             super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.replacep == (Expression *)0x0) {
          __assert_fail("*task.currp",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                        ,0x139,
                        "void wasm::Walker<Walker, wasm::Visitor<Walker>>::walk(Expression *&) [SubType = Walker, VisitorType = wasm::Visitor<Walker>]"
                       );
        }
        (*p_Var7)(&local_138,
                  local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                  super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.replacep);
      } while (((long)local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                      super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
                      super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                      super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
                      super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) +
               local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
               super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.usedFixed != 0);
    }
    if (local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
        super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                      super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
                      super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                            super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
                            super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
                            super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.stack.flexible.
                            super__Vector_base<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::Visitor<Walker,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void runOnFunction(Module* module_, Function* func) override {
    // FIXME: This looks like it was never right, as it should ignore the top-
    //        most runtime, but it will actually instrument it (as it needs no
    //        instrumentation, like random code - but the top-most runtime is
    //        actually a place that needs neither instrumentation *nor*
    //        assertions, as the assertions will error when it changes the
    //        state).
    if (!analyzer->needsInstrumentation(func)) {
      module = module_;
      builder =
        std::make_unique<AsyncifyBuilder>(*module, pointerType, asyncifyMemory);
      addAssertsInNonInstrumented(func);
    }
  }